

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::MemoryStressCase::iterate(MemoryStressCase *this)

{
  bool bVar1;
  int iVar2;
  TestLog *pTVar3;
  iterator __position;
  int *piVar4;
  EGLConfig pvVar5;
  TestLog *pTVar6;
  ObjectType OVar7;
  deUint32 dVar8;
  int iVar9;
  MemoryAllocator *pMVar10;
  deUint64 dVar11;
  ulong uVar12;
  char *description;
  qpTestResult testResult;
  TestContext *pTVar13;
  undefined1 auVar14 [8];
  uint uVar15;
  int iVar16;
  float fVar17;
  vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
  types;
  value_type local_1dc;
  deUint64 local_1d8;
  undefined8 uStack_1d0;
  TestLog *local_1c0;
  undefined1 local_1b8 [8];
  TestLog *pTStack_1b0;
  pointer local_1a8;
  ios_base local_140 [272];
  
  pTVar13 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  pTVar3 = pTVar13->m_log;
  local_1b8 = (undefined1  [8])pTVar3;
  if (this->m_iterationCount <= this->m_iteration) {
    piVar4 = (this->m_allocationCounts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = *piVar4;
    uVar15 = (uint)((ulong)((long)(this->m_allocationCounts).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar4) >> 2);
    iVar16 = iVar9;
    if (0 < (int)uVar15) {
      uVar12 = 0;
      do {
        iVar2 = piVar4[uVar12];
        if (iVar2 < iVar9) {
          iVar9 = iVar2;
        }
        if (iVar16 < iVar2) {
          iVar16 = iVar2;
        }
        uVar12 = uVar12 + 1;
      } while ((uVar15 & 0x7fffffff) != uVar12);
    }
    if (iVar9 == 0 && iVar16 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pTStack_1b0,"Allocation count zero",0x15);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_1b0);
      std::ios_base::~ios_base(local_140);
      pTVar13 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      fVar17 = (float)(iVar9 - iVar16) / (float)iVar16;
      local_1d8 = CONCAT44(local_1d8._4_4_,fVar17);
      if (fVar17 <= 50.0) {
        tcu::TestContext::setTestResult(pTVar13,QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pTStack_1b0,"Allocated objects max: ",0x17);
      std::ostream::operator<<((ostringstream *)&pTStack_1b0,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0,", min: ",7);
      std::ostream::operator<<((ostringstream *)&pTStack_1b0,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pTStack_1b0,", difference: ",0xe);
      std::ostream::_M_insert<double>((double)(float)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pTStack_1b0,"% threshold: ",0xd);
      std::ostream::_M_insert<double>(50.0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0,"%",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_1b0);
      std::ios_base::~ios_base(local_140);
      pTVar13 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Allocation count variation";
      testResult = QP_TEST_RESULT_QUALITY_WARNING;
    }
    tcu::TestContext::setTestResult(pTVar13,testResult,description);
    return STOP;
  }
  pMVar10 = this->m_allocator;
  if (pMVar10 == (MemoryAllocator *)0x0) {
    pMVar10 = (MemoryAllocator *)operator_new(0x1ac0);
    dVar8 = this->m_seed;
    local_1d8._0_4_ = (float)(this->m_spec).types;
    local_1d8._4_4_ = (this->m_spec).minWidth;
    uStack_1d0._0_4_ = (this->m_spec).minHeight;
    uStack_1d0._4_4_ = (this->m_spec).maxWidth;
    iVar9 = (this->m_spec).maxHeight;
    bVar1 = (this->m_spec).use;
    pMVar10->m_eglTestCtx = (this->super_TestCase).m_eglTestCtx;
    pvVar5 = this->m_config;
    pMVar10->m_display = this->m_display;
    pMVar10->m_config = pvVar5;
    glw::Functions::Functions(&pMVar10->m_gl);
    deRandom_init(&(pMVar10->m_rnd).m_rnd,dVar8);
    pMVar10->m_failed = false;
    (pMVar10->m_errorString)._M_dataplus._M_p = (pointer)&(pMVar10->m_errorString).field_2;
    (pMVar10->m_errorString)._M_string_length = 0;
    (pMVar10->m_errorString).field_2._M_local_buf[0] = '\0';
    pMVar10->m_types = (ObjectType)(float)local_1d8;
    pMVar10->m_minWidth = local_1d8._4_4_;
    pMVar10->m_minHeight = (undefined4)uStack_1d0;
    pMVar10->m_maxWidth = uStack_1d0._4_4_;
    pMVar10->m_maxHeight = iVar9;
    pMVar10->m_use = bVar1;
    (pMVar10->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pMVar10->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pMVar10->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pMVar10->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pMVar10->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pMVar10->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    EglTestContext::initGLFunctions(pMVar10->m_eglTestCtx,&pMVar10->m_gl,(ApiType)0x2);
    this->m_allocator = pMVar10;
  }
  local_1d8 = deGetMicroseconds();
  local_1b8 = (undefined1  [8])0x0;
  pTStack_1b0 = (TestLog *)0x0;
  local_1a8 = (pointer)0x0;
  OVar7 = pMVar10->m_types;
  if ((OVar7 & OBJECTTYPE_CONTEXT) != 0) {
    local_1dc = OBJECTTYPE_CONTEXT;
    std::
    vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
    ::push_back((vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                 *)local_1b8,&local_1dc);
    OVar7 = pMVar10->m_types;
  }
  if ((OVar7 & OBJECTTYPE_PBUFFER) != 0) {
    local_1dc = OBJECTTYPE_PBUFFER;
    std::
    vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
    ::push_back((vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                 *)local_1b8,&local_1dc);
  }
  if ((((pMVar10->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (pMVar10->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start) &&
      ((pMVar10->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (pMVar10->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_start)) && (pMVar10->m_use == true)) {
    egl::anon_unknown_0::MemoryAllocator::allocateContext(pMVar10);
    egl::anon_unknown_0::MemoryAllocator::allocatePBuffer(pMVar10);
  }
  pTVar6 = pTStack_1b0;
  local_1c0 = (TestLog *)local_1b8;
  auVar14 = local_1b8;
  do {
    bVar1 = pMVar10->m_failed;
    if (bVar1 != false) break;
    if (auVar14 != (undefined1  [8])pTVar6) {
      iVar9 = 0;
      uVar15 = 1;
      do {
        if (((int)(uVar15 - 1) < 1) ||
           (dVar8 = deRandom_getUint32(&(pMVar10->m_rnd).m_rnd), dVar8 % uVar15 == 0)) {
          iVar9 = *(int *)&((TestLog *)auVar14)->m_log;
        }
        auVar14 = (undefined1  [8])((long)&((TestLog *)auVar14)->m_log + 4);
        uVar15 = uVar15 + 1;
      } while (auVar14 != (undefined1  [8])pTVar6);
      if (iVar9 == 1) {
        egl::anon_unknown_0::MemoryAllocator::allocatePBuffer(pMVar10);
        auVar14 = (undefined1  [8])local_1c0;
      }
      else {
        auVar14 = (undefined1  [8])local_1c0;
        if (iVar9 == 2) {
          egl::anon_unknown_0::MemoryAllocator::allocateContext(pMVar10);
        }
      }
    }
    dVar11 = deGetMicroseconds();
  } while (dVar11 - local_1d8 < 0x989681);
  if (auVar14 != (undefined1  [8])0x0) {
    operator_delete((void *)auVar14,(long)local_1a8 - (long)auVar14);
  }
  if (bVar1 == false) {
    local_1b8 = (undefined1  [8])pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pTStack_1b0,"Couldn\'t exhaust memory before timeout. Allocated ",0x32);
    pMVar10 = this->m_allocator;
    std::ostream::operator<<
              ((ostringstream *)&pTStack_1b0,
               (int)((ulong)((long)(pMVar10->m_contexts).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(pMVar10->m_contexts).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3) +
               (int)((ulong)((long)(pMVar10->m_pbuffers).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(pMVar10->m_pbuffers).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0," objects.",9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_1b0);
    std::ios_base::~ios_base(local_140);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    pMVar10 = this->m_allocator;
    if (pMVar10 != (MemoryAllocator *)0x0) {
      egl::anon_unknown_0::MemoryAllocator::~MemoryAllocator(pMVar10);
    }
    operator_delete(pMVar10,0x1ac0);
    this->m_allocator = (MemoryAllocator *)0x0;
    return STOP;
  }
  local_1b8 = (undefined1  [8])pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0,"Iteration ",10);
  std::ostream::operator<<((ostringstream *)&pTStack_1b0,this->m_iteration);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0,": Allocated ",0xc);
  pMVar10 = this->m_allocator;
  std::ostream::operator<<
            ((ostringstream *)&pTStack_1b0,
             (int)((ulong)((long)(pMVar10->m_contexts).
                                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(pMVar10->m_contexts).
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3) +
             (int)((ulong)((long)(pMVar10->m_pbuffers).
                                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(pMVar10->m_pbuffers).
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0," objects; ",10);
  std::ostream::operator<<
            ((ostringstream *)&pTStack_1b0,
             (int)((ulong)((long)(this->m_allocator->m_contexts).
                                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->m_allocator->m_contexts).
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0," contexts, ",0xb);
  std::ostream::operator<<
            ((ostringstream *)&pTStack_1b0,
             (int)((ulong)((long)(this->m_allocator->m_pbuffers).
                                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->m_allocator->m_pbuffers).
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_1b0," PBuffers.",10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_1b0);
  std::ios_base::~ios_base(local_140);
  local_1b8 = (undefined1  [8])pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pTStack_1b0,"Got expected error: ",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pTStack_1b0,(this->m_allocator->m_errorString)._M_dataplus._M_p,
             (this->m_allocator->m_errorString)._M_string_length);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_1b0);
  std::ios_base::~ios_base(local_140);
  pMVar10 = this->m_allocator;
  iVar9 = (int)((ulong)((long)(pMVar10->m_contexts).
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(pMVar10->m_contexts).
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) +
          (int)((ulong)((long)(pMVar10->m_pbuffers).
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(pMVar10->m_pbuffers).
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  local_1b8._0_4_ = iVar9;
  __position._M_current =
       (this->m_allocationCounts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_allocationCounts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->m_allocationCounts,__position,(int *)local_1b8);
    pMVar10 = this->m_allocator;
    if (pMVar10 == (MemoryAllocator *)0x0) {
      pMVar10 = (MemoryAllocator *)0x0;
      goto LAB_00e17c8a;
    }
  }
  else {
    *__position._M_current = iVar9;
    (this->m_allocationCounts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  egl::anon_unknown_0::MemoryAllocator::~MemoryAllocator(pMVar10);
LAB_00e17c8a:
  operator_delete(pMVar10,0x1ac0);
  this->m_allocator = (MemoryAllocator *)0x0;
  this->m_iteration = this->m_iteration + 1;
  return CONTINUE;
}

Assistant:

TestCase::IterateResult MemoryStressCase::iterate (void)
{
	TestLog& log = m_testCtx.getLog();

	if (m_iteration < m_iterationCount)
	{
		try
		{
			if (!m_allocator)
				m_allocator = new MemoryAllocator(m_eglTestCtx, m_display, m_config, m_seed, m_spec.types, m_spec.minWidth, m_spec.minHeight, m_spec.maxWidth, m_spec.maxHeight, m_spec.use);

			if (m_allocator->allocateUntilFailure())
			{
				log << TestLog::Message << "Couldn't exhaust memory before timeout. Allocated " << m_allocator->getAllocationCount() << " objects." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

				delete m_allocator;
				m_allocator = NULL;

				return STOP;
			}

			log << TestLog::Message << "Iteration " << m_iteration << ": Allocated " << m_allocator->getAllocationCount() << " objects; " << m_allocator->getContextCount() << " contexts, " << m_allocator->getPBufferCount() << " PBuffers." << TestLog::EndMessage;
			log << TestLog::Message << "Got expected error: " << m_allocator->getErrorString() << TestLog::EndMessage;
			m_allocationCounts.push_back(m_allocator->getAllocationCount());

			delete m_allocator;
			m_allocator = NULL;

			m_iteration++;

			return CONTINUE;
		} catch (...)
		{
			log << TestLog::Message << "Iteration " << m_iteration << ": Allocated " << m_allocator->getAllocationCount() << " objects; " << m_allocator->getContextCount() << " contexts, " << m_allocator->getPBufferCount() << " PBuffers." << TestLog::EndMessage;
			log << TestLog::Message << "Unexpected error" << TestLog::EndMessage;
			throw;
		}
	}
	else
	{
		// Analyze number of passed allocations.
		int min = m_allocationCounts[0];
		int max = m_allocationCounts[0];

		float threshold = 50.0f;

		for (int allocNdx = 0; allocNdx < (int)m_allocationCounts.size(); allocNdx++)
		{
			min = deMin32(m_allocationCounts[allocNdx], min);
			max = deMax32(m_allocationCounts[allocNdx], max);
		}

		if (min == 0 && max != 0)
		{
			log << TestLog::Message << "Allocation count zero" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
		else
		{
			float change = (float)(min - max) / ((float)(max));

			if (change > threshold)
			{
				log << TestLog::Message << "Allocated objects max: " << max << ", min: " << min << ", difference: " << change << "% threshold: " << threshold << "%" << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Allocation count variation");
			}
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}

		return STOP;
	}
}